

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_build_polygon_boundaries.cc
# Opt level: O2

void s2shapeutil::BuildPolygonBoundaries
               (vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                *components,
               vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
               *polygons)

{
  pointer pvVar1;
  Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
  *pSVar2;
  long *plVar3;
  S2Shape *pSVar4;
  S2Shape *pSVar5;
  bool bVar6;
  int iVar7;
  unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *ptr;
  ulong uVar8;
  long lVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  pointer ppVar12;
  btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
  *pbVar13;
  long *plVar14;
  pointer *__ptr;
  int i;
  ulong uVar15;
  S2Shape *pSVar16;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> *this;
  long lVar17;
  Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
  *pSVar18;
  iterator iVar19;
  _Head_base<0UL,_S2Shape_*,_false> local_198;
  S2Shape *ancestor;
  _Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_> local_188;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  *local_170;
  vector<S2Shape_*,_std::allocator<S2Shape_*>_> outer_loops;
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ancestors;
  btree_map<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256>
  children;
  vector<int,_std::allocator<int>_> component_ids;
  MutableS2ShapeIndex index;
  S2ContainsPointQuery<MutableS2ShapeIndex> contains_query;
  
  local_170 = polygons;
  std::
  vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
  ::clear(polygons);
  if ((components->
      super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (components->
      super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
  MutableS2ShapeIndex::MutableS2ShapeIndex(&index);
  component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar9 = 0;
  do {
    ancestors.
    super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)lVar9;
    uVar15 = (ulong)(int)ancestors.
                         super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
    pvVar1 = (components->
             super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = ((long)(components->
                   super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
    if (uVar8 <= uVar15) {
      std::
      vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      ::vector(&ancestors,uVar8,(allocator_type *)&contains_query);
      children.
      super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .
      super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .
      super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .tree_.root_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
      .value._0_4_ = 1;
      S2ContainsPointQuery<MutableS2ShapeIndex>::S2ContainsPointQuery
                (&contains_query,&index,(Options *)&children);
      lVar9 = 0;
      uVar8 = 0;
      goto LAB_0025af57;
    }
    pSVar2 = (Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
              *)pvVar1[uVar15].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    for (pSVar18 = *(Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                     **)&pvVar1[uVar15].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                         _M_impl.super__Vector_impl_data; pSVar18 != pSVar2; pSVar18 = pSVar18 + 1)
    {
      children.
      super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .
      super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .
      super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
      .tree_.root_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
      .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                )pSVar18->value;
      if ((ulong)((long)pvVar1[uVar15].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 *(long *)&pvVar1[uVar15].super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>.
                           _M_impl.super__Vector_impl_data) < 9) {
LAB_0025ae4e:
        std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back
                  (&outer_loops,(value_type *)&children);
      }
      else {
        contains_query.index_ = (MutableS2ShapeIndex *)0xbf847a99aa86ed3b;
        contains_query.options_.vertex_model_ = 0x488bec88;
        contains_query._12_4_ = 0x3f653cc5;
        contains_query.it_.super_IteratorBase._vptr_IteratorBase = (_func_int **)0x3fefff901a72d2ac;
        bVar6 = ContainsBruteForce((S2Shape *)
                                   children.
                                   super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                                   .tree_.root_.
                                   super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                                   .
                                   super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
                                   .value,(S2Point *)&contains_query);
        if (bVar6) goto LAB_0025ae4e;
        local_198._M_head_impl =
             (S2Shape *)
             children.
             super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
             .
             super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
             .
             super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
             .tree_.root_.
             super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
             .
             super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
             .value;
        MutableS2ShapeIndex::Add
                  (&index,(unique_ptr<S2Shape,_std::default_delete<S2Shape>_> *)&local_198);
        if (local_198._M_head_impl != (S2Shape *)0x0) {
          (*(local_198._M_head_impl)->_vptr_S2Shape[1])();
        }
        local_198._M_head_impl = (S2Shape *)0x0;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&component_ids,(value_type_conflict2 *)&ancestors);
      }
    }
    lVar9 = (long)(int)ancestors.
                       super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
  } while ((long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3 == lVar9);
  S2LogMessage::S2LogMessage
            ((S2LogMessage *)&contains_query,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
             ,0x4b,kFatal,(ostream *)&std::cerr);
  poVar10 = std::operator<<((ostream *)contains_query._8_8_,
                            "Check failed: (i + 1) == (outer_loops.size()) ");
  std::operator<<(poVar10,"Component is not a subdivision");
LAB_0025b23c:
  abort();
LAB_0025af57:
  if ((ulong)((long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) <= uVar8) goto LAB_0025afc4;
  pSVar16 = outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8];
  iVar7 = (*pSVar16->_vptr_S2Shape[2])(pSVar16);
  if (iVar7 < 1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&children,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
               ,0x52,kFatal,(ostream *)&std::cerr);
    std::operator<<((ostream *)
                    children.
                    super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                    .
                    super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                    .
                    super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                    .tree_.rightmost_,"Check failed: (loop->num_edges()) > (0) ");
    goto LAB_0025b23c;
  }
  (*pSVar16->_vptr_S2Shape[3])((S2Point *)&children,pSVar16,0);
  S2ContainsPointQuery<MutableS2ShapeIndex>::GetContainingShapes
            ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)&local_188,&contains_query,
             (S2Point *)&children);
  std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::_M_move_assign
            ((vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)
             (CONCAT44(ancestors.
                       super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       (int)ancestors.
                            super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) + lVar9),&local_188);
  std::_Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>::~_Vector_base(&local_188);
  uVar8 = uVar8 + 1;
  lVar9 = lVar9 + 0x18;
  goto LAB_0025af57;
LAB_0025afc4:
  children.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .tree_.size_ = 0;
  children.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .tree_.root_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
            )(Storage<absl::container_internal::CompressedTuple<std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
  children.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
  .tree_.rightmost_ = (node_type *)0x0;
  uVar8 = 0;
  do {
    if ((ulong)((long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar8) {
      std::
      vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      ::resize(local_170,
               ((long)index.shapes_.
                      super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)index.shapes_.
                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) * 0x20000000 + 0x100000000 >> 0x20);
      lVar17 = 0;
      for (lVar9 = 0;
          lVar9 < (int)((ulong)((long)index.shapes_.
                                      super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)index.shapes_.
                                     super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar9 = lVar9 + 1) {
        this = (vector<S2Shape_*,_std::allocator<S2Shape_*>_> *)
               ((long)&(((local_170->
                         super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17);
        ancestor = index.shapes_.
                   super__Vector_base<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar9]._M_t.
                   super___uniq_ptr_impl<S2Shape,_std::default_delete<S2Shape>_>._M_t.
                   super__Tuple_impl<0UL,_S2Shape_*,_std::default_delete<S2Shape>_>.
                   super__Head_base<0UL,_S2Shape_*,_false>._M_head_impl;
        iVar19 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                 ::find_unique<S2Shape*>
                           ((btree<gtl::internal_btree::map_params<S2Shape*,std::vector<S2Shape*,std::allocator<S2Shape*>>,std::less<S2Shape*>,std::allocator<std::pair<S2Shape*const,std::vector<S2Shape*,std::allocator<S2Shape*>>>>,256,false>>
                             *)&children,&ancestor);
        local_188._M_impl.super__Vector_impl_data._M_start = (pointer)iVar19.node;
        local_188._M_impl.super__Vector_impl_data._M_finish._0_4_ = iVar19.position;
        iVar19 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                 ::end((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                        *)&children);
        if (((btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
              *)local_188._M_impl.super__Vector_impl_data._M_start != iVar19.node) ||
           ((int)local_188._M_impl.super__Vector_impl_data._M_finish != iVar19.position)) {
          ppVar12 = gtl::internal_btree::
                    btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                    ::operator->((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_&,_std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_*>
                                  *)&local_188);
          std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=(this,&ppVar12->second);
        }
        std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back(this,&ancestor);
        lVar17 = lVar17 + 0x18;
      }
      local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      pmVar11 = gtl::internal_btree::
                btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                ::operator[](&children.
                              super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                             ,(key_type *)&local_188);
      std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::operator=
                ((local_170->
                 super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + -1,pmVar11);
      MutableS2ShapeIndex::ReleaseAll
                ((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                  *)&local_188,&index);
      for (pbVar13 = (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                      *)local_188._M_impl.super__Vector_impl_data._M_start;
          pbVar13 !=
          (btree_node<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
           *)CONCAT44(local_188._M_impl.super__Vector_impl_data._M_finish._4_4_,
                      (int)local_188._M_impl.super__Vector_impl_data._M_finish);
          pbVar13 = pbVar13 + 8) {
        *(S2Shape **)&pbVar13->field_0x0 = (S2Shape *)0x0;
      }
      std::
      vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
      ::~vector((vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
                 *)&local_188);
      gtl::internal_btree::
      btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
      ::~btree((btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>
                *)&children);
      std::
      vector<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
      ::~vector(&ancestors);
      std::_Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>::~_Vector_base
                (&outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&component_ids.super__Vector_base<int,_std::allocator<int>_>);
      MutableS2ShapeIndex::~MutableS2ShapeIndex(&index);
      return;
    }
    ancestor = (S2Shape *)0x0;
    lVar9 = CONCAT44(ancestors.
                     super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     (int)ancestors.
                          super__Vector_base<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::allocator<std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    plVar14 = *(long **)(lVar9 + uVar8 * 0x18);
    plVar3 = *(long **)(lVar9 + 8 + uVar8 * 0x18);
    iVar7 = (int)((long)plVar3 - (long)plVar14 >> 3);
    if (0 < iVar7) {
      pSVar16 = (S2Shape *)0x0;
      for (; plVar14 != plVar3; plVar14 = plVar14 + 1) {
        pSVar4 = (S2Shape *)*plVar14;
        pSVar5 = ancestor;
        if ((*(long *)(lVar9 + 8 +
                      (long)component_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[pSVar4->id_] * 0x18) -
             *(long *)(lVar9 + (long)component_ids.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_start[pSVar4->id_] * 0x18)
             >> 3 == (ulong)(iVar7 - 1)) &&
           (bVar6 = pSVar16 != (S2Shape *)0x0, pSVar16 = pSVar4, pSVar5 = pSVar4, bVar6)) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&local_188,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                     ,0x5e,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)
                          CONCAT44(local_188._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                   (int)local_188._M_impl.super__Vector_impl_data._M_finish),
                          "Check failed: ancestor == nullptr ");
          goto LAB_0025b23c;
        }
        ancestor = pSVar5;
      }
      if (pSVar16 == (S2Shape *)0x0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_188,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shapeutil_build_polygon_boundaries.cc"
                   ,0x62,kFatal,(ostream *)&std::cerr);
        std::operator<<((ostream *)
                        CONCAT44(local_188._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)local_188._M_impl.super__Vector_impl_data._M_finish),
                        "Check failed: ancestor != nullptr ");
        goto LAB_0025b23c;
      }
    }
    pmVar11 = gtl::internal_btree::
              btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
              ::operator[](&children.
                            super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2Shape_*,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>,_std::less<S2Shape_*>,_std::allocator<std::pair<S2Shape_*const,_std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>_>_>,_256,_false>_>_>
                           ,&ancestor);
    std::vector<S2Shape_*,_std::allocator<S2Shape_*>_>::push_back
              (pmVar11,outer_loops.super__Vector_base<S2Shape_*,_std::allocator<S2Shape_*>_>._M_impl
                       .super__Vector_impl_data._M_start + uVar8);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void BuildPolygonBoundaries(const vector<vector<S2Shape*>>& components,
                            vector<vector<S2Shape*>>* polygons) {
  polygons->clear();
  if (components.empty()) return;

  // Since the loop boundaries do not cross, a loop nesting hierarchy can be
  // defined by choosing any point on the sphere as the "point at infinity".
  // Loop A then contains loop B if (1) A contains the boundary of B and (2)
  // loop A does not contain the point at infinity.
  //
  // We choose S2::Origin() for this purpose.  The loop nesting hierarchy then
  // determines the face structure.  Here are the details:
  //
  // 1. Build an S2ShapeIndex of all loops that do not contain S2::Origin().
  //    This leaves at most one unindexed loop per connected component
  //    (the "outer loop").
  //
  // 2. For each component, choose a representative vertex and determine
  //    which indexed loops contain it.  The "depth" of this component is
  //    defined as the number of such loops.
  //
  // 3. Assign the outer loop of each component to the containing loop whose
  //    depth is one less.  This generates a set of multi-loop polygons.
  //
  // 4. The outer loops of all components at depth 0 become a single face.

  MutableS2ShapeIndex index;
  // A map from shape.id() to the corresponding component number.
  vector<int> component_ids;
  vector<S2Shape*> outer_loops;
  for (int i = 0; i < components.size(); ++i) {
    const auto& component = components[i];
    for (S2Shape* loop : component) {
      if (component.size() > 1 &&
          !s2shapeutil::ContainsBruteForce(*loop, S2::Origin())) {
        // Ownership is transferred back at the end of this function.
        index.Add(WrapUnique(loop));
        component_ids.push_back(i);
      } else {
        outer_loops.push_back(loop);
      }
    }
    // Check that there is exactly one outer loop in each component.
    S2_DCHECK_EQ(i + 1, outer_loops.size()) << "Component is not a subdivision";
  }
  // Find the loops containing each component.
  vector<vector<S2Shape*>> ancestors(components.size());
  auto contains_query = MakeS2ContainsPointQuery(&index);
  for (int i = 0; i < outer_loops.size(); ++i) {
    auto loop = outer_loops[i];
    S2_DCHECK_GT(loop->num_edges(), 0);
    ancestors[i] = contains_query.GetContainingShapes(loop->edge(0).v0);
  }
  // Assign each outer loop to the component whose depth is one less.
  // Components at depth 0 become a single face.
  gtl::btree_map<S2Shape*, vector<S2Shape*>> children;
  for (int i = 0; i < outer_loops.size(); ++i) {
    S2Shape* ancestor = nullptr;
    int depth = ancestors[i].size();
    if (depth > 0) {
      for (auto candidate : ancestors[i]) {
        if (ancestors[component_ids[candidate->id()]].size() == depth - 1) {
          S2_DCHECK(ancestor == nullptr);
          ancestor = candidate;
        }
      }
      S2_DCHECK(ancestor != nullptr);
    }
    children[ancestor].push_back(outer_loops[i]);
  }
  // There is one face per loop that is not an outer loop, plus one for the
  // outer loops of components at depth 0.
  polygons->resize(index.num_shape_ids() + 1);
  for (int i = 0; i < index.num_shape_ids(); ++i) {
    auto polygon = &(*polygons)[i];
    auto loop = index.shape(i);
    auto itr = children.find(loop);
    if (itr != children.end()) {
      *polygon = itr->second;
    }
    polygon->push_back(loop);
  }
  polygons->back() = children[nullptr];

  // Explicitly release the shapes from the index so they are not deleted.
  for (auto& ptr : index.ReleaseAll()) ptr.release();
}